

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O2

void get_FMlong8(FMFieldPtr field,void *data,unsigned_long *low_long,long *high_long)

{
  uchar uVar1;
  size_t sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  unsigned_long_long uVar5;
  longlong lVar6;
  unsigned_long uVar7;
  longdouble in_ST0;
  FMgetFieldStruct tmp_field;
  
  *low_long = 0;
  if (high_long != (long *)0x0) {
    *high_long = 0;
  }
  if (field->data_type == float_type) {
    get_big_float((longdouble *)field,(FMFieldPtr)data,low_long);
    uVar7 = (unsigned_long)ROUND(in_ST0);
  }
  else {
    if (field->data_type != integer_type) {
      fwrite("Get IOlong8 failed on invalid data type!\n",0x29,1,_stderr);
      exit(1);
    }
    if (field->size == 0x10) {
      sVar2 = field->offset;
      tmp_field.byte_swap = field->byte_swap;
      tmp_field.src_float_format = field->src_float_format;
      tmp_field.target_float_format = field->target_float_format;
      tmp_field._19_5_ = *(undefined5 *)&field->field_0x13;
      uVar3 = field->data_type;
      uVar1 = field->byte_swap;
      tmp_field.offset = sVar2 + 8;
      if (uVar1 == '\0') {
        tmp_field.offset = sVar2;
      }
      tmp_field.data_type = uVar3;
      tmp_field.size = 8;
      uVar5 = get_big_unsigned(&tmp_field,data);
      *low_long = uVar5;
      if (high_long == (long *)0x0) {
        return;
      }
      tmp_field.offset = sVar2;
      if (uVar1 == '\0') {
        tmp_field.offset = sVar2 + 8;
      }
      uVar4 = field->data_type;
      tmp_field.byte_swap = field->byte_swap;
      tmp_field.src_float_format = field->src_float_format;
      tmp_field.target_float_format = field->target_float_format;
      tmp_field._19_5_ = *(undefined5 *)&field->field_0x13;
      tmp_field.data_type = uVar4;
      tmp_field.size = 8;
      lVar6 = get_big_int(&tmp_field,data);
      *high_long = lVar6;
      return;
    }
    uVar7 = get_big_int(field,data);
  }
  *low_long = uVar7;
  return;
}

Assistant:

extern void
get_FMlong8(FMFieldPtr field, void *data, unsigned long *low_long, long *high_long)
{
    *low_long = 0;
    if (high_long)
	*high_long = 0;
    if (field->data_type == integer_type) {
	if (field->size == 2 * sizeof(long)) {
	    size_t low_bytes_offset = field->offset;
	    size_t high_bytes_offset = field->offset;
	    FMgetFieldStruct tmp_field;  /*OK */
	    tmp_field = *field;
	    if (WORDS_BIGENDIAN) {
		if (field->byte_swap) {
		    high_bytes_offset += sizeof(long);
		} else {
		    low_bytes_offset += sizeof(long);
		}
	    } else {
		if (field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		} else {
		    high_bytes_offset += sizeof(long);
		}
	    }
	    tmp_field.size = sizeof(long);
	    tmp_field.offset = low_bytes_offset;
	    *low_long = (unsigned long) get_FMulong(&tmp_field, data);
	    if (high_long) {
		tmp_field = *field;
		tmp_field.size = sizeof(long);
		tmp_field.offset = high_bytes_offset;
		*high_long = (long) get_FMlong(&tmp_field, data);
	    }
	} else {
	    *low_long = (long) get_FMlong(field, data);
	}
    } else if (field->data_type == float_type) {
	MAX_FLOAT_TYPE tmp;
	tmp = get_big_float(field, data);
	*low_long = (long) tmp;
    } else {
	fprintf(stderr, "Get IOlong8 failed on invalid data type!\n");
	exit(1);
    }
}